

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O2

void __thiscall Rml::ElementText::ElementText(ElementText *this,String *tag)

{
  Element::Element(&this->super_Element,tag);
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementText_00397bb0;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  (this->lines).super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->geometry).
  super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->geometry).
  super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->geometry).
  super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decoration)._M_t.super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>.
  _M_t.super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
  super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl = (Geometry *)0x0;
  (this->colour).red = 0xff;
  (this->colour).green = 0xff;
  (this->colour).blue = 0xff;
  (this->colour).alpha = 0xff;
  this->opacity = 1.0;
  this->font_handle_version = 0;
  this->field_0x1ec = this->field_0x1ec | 3;
  this->generated_decoration = None;
  this->decoration_property = None;
  this->font_effects_dirty = true;
  this->font_effects_handle = 0;
  return;
}

Assistant:

ElementText::ElementText(const String& tag) :
	Element(tag), colour(255, 255, 255), opacity(1), font_handle_version(0), geometry_dirty(true), dirty_layout_on_change(true),
	generated_decoration(Style::TextDecoration::None), decoration_property(Style::TextDecoration::None), font_effects_dirty(true),
	font_effects_handle(0)
{}